

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>
::
find<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Entry,unsigned_int&>
          (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>
           *this,ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import>::Entry>
                 table,uint *params)

{
  uint uVar1;
  Disposer *pDVar2;
  RpcClient *pRVar3;
  _func_int ***ppp_Var4;
  uint *in_R8;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  Disposer *pDVar8;
  Maybe<unsigned_long> MVar9;
  Maybe<unsigned_long> MVar10;
  
  MVar9.ptr.field_1.value = table.size_;
  pDVar2 = ((table.ptr)->value).promiseFulfiller.ptr.disposer;
  if (pDVar2 == (Disposer *)0x0) {
    *this = (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>
             )0x0;
    MVar9.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar9.ptr;
  }
  uVar1 = *in_R8;
  uVar5 = uVar1 * 0x8000 + ~uVar1;
  uVar5 = (uVar5 >> 0xc ^ uVar5) * 5;
  uVar6 = (uVar5 >> 4 ^ uVar5) * 0x809;
  uVar6 = uVar6 >> 0x10 ^ uVar6;
  uVar7 = (ulong)((int)pDVar2 - 1U & uVar6);
  pRVar3 = ((table.ptr)->value).appClient.ptr;
  uVar5 = *(uint *)((long)&(pRVar3->super_ClientHook)._vptr_ClientHook + uVar7 * 8 + 4);
  if (uVar5 != 0) {
    ppp_Var4 = &(pRVar3->super_ClientHook)._vptr_ClientHook + uVar7;
    do {
      if (((uVar5 != 1) && (*(uint *)ppp_Var4 == uVar6)) &&
         (*(uint *)(MVar9.ptr.field_1.value + (ulong)(uVar5 - 2) * 0x28) == uVar1)) {
        *this = (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>
                 )0x1;
        *(ulong *)(this + 8) = (ulong)(uVar5 - 2);
        goto LAB_0033fdb1;
      }
      pDVar8 = (Disposer *)(uVar7 + 1);
      uVar7 = (ulong)pDVar8 & 0xffffffff;
      if (pDVar8 == pDVar2) {
        uVar7 = 0;
      }
      ppp_Var4 = &(pRVar3->super_ClientHook)._vptr_ClientHook + uVar7;
      uVar5 = *(uint *)((long)ppp_Var4 + 4);
    } while (uVar5 != 0);
  }
  *this = (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>
           )0x0;
LAB_0033fdb1:
  MVar10.ptr.field_1.value = MVar9.ptr.field_1.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }